

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O1

QDBusArgument * operator>>(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  char cVar1;
  bool bVar2;
  QDBusArgument *arg_00;
  QMetaType QVar3;
  QDBusMenuLayoutItem *pQVar4;
  QDBusArgumentPrivate *pQVar5;
  long in_FS_OFFSET;
  QDBusArgument childArgument;
  QDBusMenuLayoutItem child;
  QDBusArgument local_a0;
  QMetaType local_98;
  QMetaType local_90;
  QDBusArgumentPrivate *local_88;
  QVariantMap QStack_80;
  QArrayDataPointer<QDBusMenuLayoutItem> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  arg_00 = (QDBusArgument *)QDBusArgument::operator>>(arg,&item->m_id);
  operator>><QMap,_QString,_QVariant,_true>(arg_00,&item->m_properties);
  QDBusArgument::beginArray();
  cVar1 = QDBusArgument::atEnd();
  if (cVar1 == '\0') {
    do {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QDBusArgument::operator>>(arg,(QDBusVariant *)&local_58);
      local_a0.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QVariant::QVariant((QVariant *)&local_88,(QVariant *)&local_58);
      local_90.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
      local_98.d_ptr = (QMetaTypeInterface *)((ulong)local_78.ptr & 0xfffffffffffffffc);
      bVar2 = comparesEqual(&local_98,&local_90);
      if (bVar2) {
        if (((ulong)local_78.ptr & 1) == 0) {
          local_a0.d = local_88;
          local_88 = (QDBusArgumentPrivate *)0x0;
        }
        else {
          pQVar5 = local_88 + *(int *)(local_88 + 4);
          if (*(int *)local_88 == 1) {
            local_a0.d = *pQVar5;
            *(undefined8 *)pQVar5 = 0;
          }
          else {
            QDBusArgument::QDBusArgument(&local_a0,(QDBusArgument *)pQVar5);
          }
        }
      }
      else {
        local_a0.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QDBusArgument::QDBusArgument(&local_a0);
        QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        pQVar4 = (QDBusMenuLayoutItem *)&local_88;
        if (((ulong)local_78.ptr & 1) != 0) {
          pQVar4 = (QDBusMenuLayoutItem *)(local_88 + *(int *)(local_88 + 4));
        }
        QMetaType::convert(QVar3,pQVar4,local_90,&local_a0);
      }
      QVariant::~QVariant((QVariant *)&local_88);
      local_88 = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QDBusMenuLayoutItem *)0x0;
      local_78.size = 0;
      QStack_80.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      local_78.d = (Data *)0x0;
      operator>>(&local_a0,(QDBusMenuLayoutItem *)&local_88);
      QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
                ((QMovableArrayOps<QDBusMenuLayoutItem> *)&item->m_children,
                 (item->m_children).d.size,(QDBusMenuLayoutItem *)&local_88);
      QList<QDBusMenuLayoutItem>::end(&item->m_children);
      QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&local_78);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&QStack_80.d);
      QDBusArgument::~QDBusArgument(&local_a0);
      QVariant::~QVariant((QVariant *)&local_58);
      cVar1 = QDBusArgument::atEnd();
    } while (cVar1 == '\0');
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return arg;
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &arg, QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg >> item.m_id >> item.m_properties;
    arg.beginArray();
    while (!arg.atEnd()) {
        QDBusVariant dbusVariant;
        arg >> dbusVariant;
        QDBusArgument childArgument = qvariant_cast<QDBusArgument>(dbusVariant.variant());

        QDBusMenuLayoutItem child;
        childArgument >> child;
        item.m_children.append(child);
    }
    arg.endArray();
    arg.endStructure();
    return arg;
}